

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  int iVar1;
  uint uVar2;
  EXRHeader *exr_header;
  pointer pvVar3;
  ulong uVar4;
  long *plVar5;
  bool bVar6;
  char **ppcVar7;
  EXRHeader **ppEVar8;
  int iVar9;
  int iVar10;
  OffsetData *pOVar11;
  long lVar12;
  pointer pOVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  char *pcVar20;
  ulong *puVar21;
  pointer pOVar22;
  ulong uVar23;
  size_t sVar24;
  OffsetData *pOVar25;
  bool bVar26;
  byte bVar27;
  bool bVar28;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  string local_100;
  ulong *local_e0;
  OffsetData *local_d8;
  size_t local_d0;
  char **local_c8;
  uint local_bc;
  OffsetData *local_b8;
  ulong local_b0;
  pointer local_a8;
  ulong local_a0;
  EXRHeader **local_98;
  uchar *local_90;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_88;
  EXRImage *local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  local_d0 = size;
  local_90 = memory;
  local_70 = exr_images;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    pcVar20 = "Invalid argument for LoadEXRMultipartImageFromMemory()";
    pcVar15 = "";
LAB_0022b409:
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar20,pcVar15);
    if (err != (char **)0x0) {
      pcVar15 = strdup(local_100._M_dataplus._M_p);
      *err = pcVar15;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    iVar19 = -3;
  }
  else {
    local_b8 = (OffsetData *)(ulong)num_parts;
    pOVar11 = (OffsetData *)0x0;
    lVar18 = 0;
    do {
      if ((ulong)exr_headers[(long)pOVar11]->header_len == 0) {
        pcVar20 = "EXRHeader variable is not initialized.";
        pcVar15 = "";
        goto LAB_0022b409;
      }
      lVar18 = lVar18 + (ulong)exr_headers[(long)pOVar11]->header_len;
      pOVar11 = (OffsetData *)
                ((long)&(pOVar11->offsets).
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_b8 != pOVar11);
    local_88.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bc = num_parts;
    local_98 = exr_headers;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&local_88,(size_type)local_b8);
    bVar26 = local_bc != 0;
    local_c8 = err;
    if (local_bc == 0) {
      iVar19 = -3;
    }
    else {
      puVar21 = (ulong *)(local_90 + lVar18 + 9);
      iVar19 = -3;
      pOVar11 = (OffsetData *)0x0;
      do {
        local_e0 = puVar21;
        std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                  (&local_88,
                   ((long)local_88.
                          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_88.
                          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
        local_a8 = local_88.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        pOVar25 = local_88.
                  super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1;
        exr_header = local_98[(long)pOVar11];
        if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
          tinyexr::InitSingleResolutionOffsets(pOVar25,(long)exr_header->chunk_count);
          plVar5 = *(long **)&(((pOVar25->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              )._M_impl;
          lVar18 = *plVar5;
          bVar28 = plVar5[1] != lVar18;
          puVar21 = local_e0;
          if (bVar28) {
            uVar23 = 0;
            do {
              uVar17 = *puVar21;
              if (uVar17 < local_d0) {
                *(ulong *)(lVar18 + uVar23 * 8) = uVar17 + 4;
                puVar21 = puVar21 + 1;
              }
              else {
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_100,"Invalid offset size in EXR header chunks.","");
                if (err != (char **)0x0) {
                  pcVar15 = strdup(local_100._M_dataplus._M_p);
                  *err = pcVar15;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p);
                }
                iVar19 = -4;
              }
              if (local_d0 <= uVar17) {
                iVar10 = 1;
                goto LAB_0022b3b8;
              }
              uVar23 = uVar23 + 1;
              lVar18 = *plVar5;
              bVar28 = uVar23 < (ulong)(plVar5[1] - lVar18 >> 3);
            } while (bVar28);
          }
          iVar10 = 0;
LAB_0022b3b8:
          if (!bVar28) {
LAB_0022b3c2:
            iVar10 = 0;
          }
        }
        else {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_d8 = pOVar25;
          tinyexr::PrecalculateTileInfo(&local_48,&local_68,exr_header);
          ppEVar8 = local_98;
          iVar9 = tinyexr::InitTileOffsets(local_d8,local_98[(long)pOVar11],&local_48,&local_68);
          pOVar25 = local_d8;
          iVar1 = ppEVar8[(long)pOVar11]->chunk_count;
          if (iVar9 != iVar1) {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,"Invalid offset table size.","");
            if (err != (char **)0x0) {
              pcVar15 = strdup(local_100._M_dataplus._M_p);
              *err = pcVar15;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            iVar19 = -4;
          }
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          iVar10 = 1;
          puVar21 = local_e0;
          if (iVar9 == iVar1) {
            if (local_a8[-1].offsets.
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_a8[-1].offsets.
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar23 = 0;
              do {
                pvVar3 = (pOVar25->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar10 = 0xe;
                uVar17 = uVar23;
                if (*(pointer *)
                     ((long)&pvVar3[uVar23].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl + 8) !=
                    *(pointer *)
                     &pvVar3[uVar23].
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl) {
                  uVar16 = 0;
                  sVar24 = local_d0;
                  local_b0 = uVar23;
                  do {
                    lVar18 = *(long *)&(pOVar25->offsets).
                                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar23].
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl;
                    lVar12 = *(long *)(lVar18 + uVar16 * 0x18);
                    iVar10 = 0x11;
                    bVar27 = *(long *)(lVar18 + 8 + uVar16 * 0x18) != lVar12;
                    if ((bool)bVar27) {
                      uVar17 = 0;
                      uVar14 = 1;
                      local_a0 = uVar16;
                      do {
                        uVar4 = *puVar21;
                        if (uVar4 < sVar24) {
                          *(ulong *)(lVar12 + uVar17 * 8) = uVar4 + 4;
                          puVar21 = puVar21 + 1;
                        }
                        else {
                          local_e0 = (ulong *)CONCAT71(local_e0._1_7_,bVar27);
                          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_100,
                                     "Invalid offset size in EXR header chunks.","");
                          ppcVar7 = local_c8;
                          if (local_c8 != (char **)0x0) {
                            pcVar15 = strdup(local_100._M_dataplus._M_p);
                            *ppcVar7 = pcVar15;
                          }
                          sVar24 = local_d0;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_100._M_dataplus._M_p != &local_100.field_2) {
                            operator_delete(local_100._M_dataplus._M_p);
                          }
                          iVar19 = -4;
                          bVar27 = (byte)local_e0;
                          pOVar25 = local_d8;
                        }
                        if (sVar24 <= uVar4) {
                          iVar10 = 1;
                          uVar16 = local_a0;
                          goto LAB_0022b25b;
                        }
                        lVar18 = *(long *)&(pOVar25->offsets).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar23].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl;
                        lVar12 = *(long *)(lVar18 + uVar16 * 0x18);
                        uVar17 = *(long *)(lVar18 + 8 + uVar16 * 0x18) - lVar12 >> 3;
                        bVar27 = uVar14 < uVar17;
                        bVar28 = uVar14 < uVar17;
                        uVar17 = uVar14;
                        uVar14 = (ulong)((int)uVar14 + 1);
                      } while (bVar28);
                      iVar10 = 0x11;
                      uVar16 = local_a0;
                    }
LAB_0022b25b:
                    uVar17 = local_b0;
                    err = local_c8;
                    if ((bVar27 & 1) != 0) goto LAB_0022b2a6;
                    pvVar3 = (pOVar25->offsets).
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar16 = (ulong)((int)uVar16 + 1);
                    uVar14 = ((long)*(pointer *)
                                     ((long)&pvVar3[uVar23].
                                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                             ._M_impl + 8) -
                              *(long *)&pvVar3[uVar23].
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl >> 3) * -0x5555555555555555;
                  } while (uVar16 <= uVar14 && uVar14 - uVar16 != 0);
                  iVar10 = 0xe;
                }
LAB_0022b2a6:
                if (iVar10 != 0xe) goto LAB_0022b3eb;
                uVar23 = (ulong)((int)uVar17 + 1);
                uVar17 = ((long)local_a8[-1].offsets.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_a8[-1].offsets.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
              } while (uVar23 <= uVar17 && uVar17 - uVar23 != 0);
            }
            iVar10 = 0xb;
LAB_0022b3eb:
            if (iVar10 == 0xb) goto LAB_0022b3c2;
          }
        }
        if (iVar10 != 0) break;
        pOVar11 = (OffsetData *)
                  ((long)&(pOVar11->offsets).
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
        bVar26 = pOVar11 < local_b8;
      } while (pOVar11 != local_b8);
    }
    if (!bVar26) {
      if (local_bc != 0) {
        pOVar11 = (OffsetData *)0x0;
        do {
          pOVar25 = local_88.
                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                    _M_impl.super__Vector_impl_data._M_start + (long)pOVar11;
          bVar27 = local_88.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pOVar11].offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_88.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pOVar11].offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_d8 = pOVar11;
          if ((bool)bVar27) {
            pOVar22 = (pointer)0x0;
            do {
              local_b0 = CONCAT71(local_b0._1_7_,bVar27);
              pvVar3 = (pOVar25->offsets).
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar26 = *(pointer *)
                        ((long)&pvVar3[(long)pOVar22].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl + 8) !=
                       *(pointer *)
                        &pvVar3[(long)pOVar22].
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl;
              local_a8 = pOVar22;
              if (bVar26) {
                uVar23 = 0;
                do {
                  lVar18 = *(long *)&(pOVar25->offsets).
                                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)pOVar22].
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl;
                  puVar21 = (ulong *)(uVar23 * 3);
                  lVar12 = *(long *)(lVar18 + uVar23 * 0x18);
                  bVar28 = *(long *)(lVar18 + 8 + uVar23 * 0x18) != lVar12;
                  local_a0 = uVar23;
                  if (bVar28) {
                    uVar23 = 0;
                    uVar17 = 1;
                    local_e0 = puVar21;
                    do {
                      uVar2 = *(uint *)(local_90 + *(long *)(lVar12 + uVar23 * 8) + -4);
                      if (pOVar11 != (OffsetData *)(ulong)uVar2) {
                        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_100,
                                   "Invalid `part number\' in EXR header chunks.","");
                        ppcVar7 = local_c8;
                        if (local_c8 != (char **)0x0) {
                          pcVar15 = strdup(local_100._M_dataplus._M_p);
                          *ppcVar7 = pcVar15;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_100._M_dataplus._M_p != &local_100.field_2) {
                          operator_delete(local_100._M_dataplus._M_p);
                        }
                        iVar19 = -4;
                        pOVar11 = local_d8;
                        puVar21 = local_e0;
                      }
                      if (pOVar11 != (OffsetData *)(ulong)uVar2) break;
                      lVar18 = *(long *)&(pOVar25->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[(long)pOVar22].
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl;
                      lVar12 = *(long *)(lVar18 + (long)puVar21 * 8);
                      uVar23 = *(long *)(lVar18 + 8 + (long)puVar21 * 8) - lVar12 >> 3;
                      bVar28 = uVar17 < uVar23;
                      bVar6 = uVar17 < uVar23;
                      uVar23 = uVar17;
                      uVar17 = (ulong)((int)uVar17 + 1);
                    } while (bVar6);
                  }
                  if (bVar28) break;
                  uVar23 = (ulong)((int)local_a0 + 1);
                  pvVar3 = (pOVar25->offsets).
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar17 = ((long)*(pointer *)
                                   ((long)&pvVar3[(long)pOVar22].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl + 8) -
                            *(long *)&pvVar3[(long)pOVar22].
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl >> 3) * -0x5555555555555555;
                  bVar28 = uVar17 - uVar23 != 0;
                  bVar26 = uVar23 <= uVar17 && bVar28;
                } while (uVar23 <= uVar17 && bVar28);
              }
              if (bVar26) {
                bVar27 = (byte)local_b0;
                break;
              }
              pOVar22 = (pointer)(ulong)((int)local_a8 + 1);
              pOVar13 = (pointer)(((long)(pOVar25->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pOVar25->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555);
              bVar26 = (long)pOVar13 - (long)pOVar22 != 0;
              bVar27 = pOVar22 <= pOVar13 && bVar26;
            } while (pOVar22 <= pOVar13 && bVar26);
          }
          if ((bVar27 & 1) == 0) {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            local_100._M_string_length = 0;
            local_100.field_2._M_local_buf[0] = '\0';
            iVar10 = tinyexr::DecodeChunk
                               (local_70 + (long)pOVar11,local_98[(long)pOVar11],pOVar25,local_90,
                                local_d0,&local_100);
            ppcVar7 = local_c8;
            bVar26 = iVar10 == 0;
            if (((!bVar26) && (iVar19 = iVar10, local_c8 != (char **)0x0)) &&
               (local_100._M_string_length != 0)) {
              pcVar15 = strdup(local_100._M_dataplus._M_p);
              *ppcVar7 = pcVar15;
            }
            pOVar11 = local_d8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
              pOVar11 = local_d8;
            }
          }
          else {
            bVar26 = false;
          }
          if (!bVar26) goto LAB_0022b6c0;
          pOVar11 = (OffsetData *)
                    ((long)&(pOVar11->offsets).
                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
        } while (pOVar11 != local_b8);
      }
      iVar19 = 0;
    }
LAB_0022b6c0:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&local_88);
  }
  return iVar19;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}